

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

string_t duckdb::UncompressedStringStorage::ReadOverflowString
                   (ColumnSegment *segment,Vector *result,block_id_t block,int32_t offset)

{
  BlockManager *block_id;
  BufferManager *pBVar1;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> _Var2;
  BlockHandle *pBVar3;
  idx_t iVar4;
  idx_t iVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  idx_t len;
  __hash_code __code;
  data_ptr_t pdVar9;
  undefined8 uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__src;
  BlockManager *__n;
  uint uVar11;
  BlockManager *vector;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  int iVar13;
  bool bVar14;
  string_t sVar15;
  BufferHandle target_handle;
  BufferHandle handle;
  float local_108;
  float fStack_104;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  optional_ptr<duckdb::FileBuffer,_true> local_f8;
  BufferHandle local_f0;
  BufferHandle local_d8;
  __node_base local_b8;
  BufferManager *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [56];
  BufferHandle local_60;
  BufferHandle local_48;
  
  local_b8._M_nxt = (_Hash_node_base *)result;
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  block_id = pBVar3->block_manager;
  pBVar1 = block_id->buffer_manager;
  local_f0.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (segment->segment_state).
           super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
           .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_f0);
  local_b0 = pBVar1;
  if (block < 0x4000000000000060) {
    local_98._32_8_ =
         local_f0.handle.internal.
         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    UncompressedStringSegmentState::GetHandle
              ((UncompressedStringSegmentState *)local_98,
               (BlockManager *)
               local_f0.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (block_id_t)block_id);
    (*pBVar1->_vptr_BufferManager[7])(&local_f0,pBVar1,(UncompressedStringSegmentState *)local_98);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f0.node);
    uVar11 = *(uint *)((local_f0.node.ptr)->buffer + offset);
    vector = (BlockManager *)(ulong)uVar11;
    BufferHandle::BufferHandle((BufferHandle *)&local_108);
    local_98._48_8_ = &block_id->block_alloc_size;
    iVar4 = optional_idx::GetIndex((optional_idx *)local_98._48_8_);
    local_98._40_8_ = &block_id->block_header_size;
    iVar5 = optional_idx::GetIndex((optional_idx *)local_98._40_8_);
    local_98._24_8_ = iVar4 - iVar5;
    if (vector < (ulong)local_98._24_8_) {
      local_a8 = (undefined1  [16])
                 StringVector::EmptyString((StringVector *)local_b8._M_nxt,(Vector *)vector,len);
      pdVar9 = local_a8._8_8_;
      if (local_a8._0_4_ < 0xd) {
        pdVar9 = local_a8 + 4;
      }
    }
    else {
      (*local_b0->_vptr_BufferManager[4])(&local_d8,local_b0,8,vector,1);
      BufferHandle::operator=((BufferHandle *)&local_108,&local_d8);
      BufferHandle::~BufferHandle(&local_d8);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f8);
      pdVar9 = (local_f8.ptr)->buffer;
    }
    local_98._16_8_ = vector;
    if (uVar11 != 0) {
      iVar13 = offset + 4;
      do {
        iVar4 = optional_idx::GetIndex((optional_idx *)local_98._48_8_);
        iVar5 = optional_idx::GetIndex((optional_idx *)local_98._40_8_);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f0.node);
        __n = (BlockManager *)((iVar4 - (iVar5 + (long)iVar13)) - 8);
        if (vector < __n) {
          __n = vector;
        }
        switchD_012dd528::default(pdVar9,(local_f0.node.ptr)->buffer + iVar13,(size_t)__n);
        iVar13 = iVar13 + (int)__n;
        uVar11 = (int)vector - (int)__n;
        vector = (BlockManager *)(ulong)uVar11;
        if (uVar11 != 0) {
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f0.node);
          UncompressedStringSegmentState::GetHandle
                    ((UncompressedStringSegmentState *)&local_d8,(BlockManager *)local_98._32_8_,
                     (block_id_t)block_id);
          uVar10 = local_98._8_8_;
          pBVar1 = local_b0;
          local_98._0_8_ =
               CONCAT44(local_d8.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _4_4_,local_d8.handle.internal.
                              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._0_4_);
          _Var2._M_head_impl._4_4_ =
               local_d8.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               ._4_4_;
          _Var2._M_head_impl._0_4_ =
               local_d8.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               ._0_4_;
          local_d8.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0.0;
          local_d8.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0;
          local_d8.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          local_d8.handle.internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 0;
          bVar14 = (StringBlock *)local_98._8_8_ != (StringBlock *)0x0;
          local_98._8_8_ = _Var2._M_head_impl;
          if (bVar14) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_d8.handle.internal.
                       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_,
                       local_d8.handle.internal.
                       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._0_4_) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_d8.handle.internal.
                                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_,
                                local_d8.handle.internal.
                                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._0_4_));
          }
          (*pBVar1->_vptr_BufferManager[7])(&local_d8,pBVar1,local_98);
          BufferHandle::operator=(&local_f0,&local_d8);
          BufferHandle::~BufferHandle(&local_d8);
          iVar13 = 0;
        }
        pdVar9 = pdVar9 + (long)__n;
      } while (uVar11 != 0);
    }
    uVar10 = local_98._16_8_;
    if ((ulong)local_98._16_8_ < (ulong)local_98._24_8_) {
      uVar7 = (ulong)(uint)local_a8._0_4_;
      if (uVar7 < 0xd) {
        switchD_01306cb1::default(local_a8 + uVar7 + 4,0,0xc - uVar7);
      }
      else {
        local_a8._4_4_ = *(undefined4 *)local_a8._8_8_;
      }
      uVar10 = local_a8._0_8_;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
    }
    else {
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f8);
      pdVar9 = (local_f8.ptr)->buffer;
      BufferHandle::BufferHandle(&local_48,(BufferHandle *)&local_108);
      StringVector::AddHandle((Vector *)local_b8._M_nxt,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_4_ = (float)uVar10;
      if ((uint)local_d8.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ <
          0xd) {
        local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = 0;
        local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._4_4_ = 0;
        local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = 0;
        if (local_d8.handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ != 0.0)
        {
          switchD_012dd528::default((void *)((long)&local_d8 + 4),pdVar9,uVar10);
        }
      }
      else {
        local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr._4_4_ = *(undefined4 *)pdVar9;
        local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_4_ = SUB84(pdVar9,0);
        local_d8.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._4_4_ = (undefined4)((ulong)pdVar9 >> 0x20);
      }
      uVar10._4_4_ = (float)local_d8.handle.internal.
                            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_;
      uVar10._0_4_ = local_d8.handle.internal.
                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                     _0_4_;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_d8.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_,
                         local_d8.handle.internal.
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._0_4_);
    }
    BufferHandle::~BufferHandle((BufferHandle *)&local_108);
    BufferHandle::~BufferHandle(&local_f0);
    if ((StringBlock *)local_98._8_8_ != (StringBlock *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  else {
    plVar6 = *(long **)(*(long *)&(((mutex *)
                                   &(local_f0.handle.internal.
                                     super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->block_manager)->super___mutex_base)._M_mutex +
                       ((ulong)block %
                       *(ulong *)&((local_f0.handle.internal.
                                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->lock).super___mutex_base._M_mutex) * 8);
    for (plVar8 = (long *)*plVar6; plVar8[1] != block; plVar8 = (long *)*plVar8) {
      plVar6 = plVar8;
    }
    (*pBVar1->_vptr_BufferManager[7])(&local_f0,pBVar1,*(undefined8 *)(*plVar6 + 0x10));
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f0.node);
    pdVar9 = (local_f0.node.ptr)->buffer;
    BufferHandle::BufferHandle(&local_60,&local_f0);
    StringVector::AddHandle((Vector *)local_b8._M_nxt,&local_60);
    BufferHandle::~BufferHandle(&local_60);
    __src = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(pdVar9 + offset) + 4);
    local_108 = *(float *)(pdVar9 + offset);
    uVar7 = (ulong)(uint)local_108;
    if (uVar7 < 0xd) {
      _Stack_100._M_pi._4_4_ = 0;
      fStack_104 = 0.0;
      _Stack_100._M_pi._0_4_ = 0;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (uVar7 != 0) {
        switchD_012dd528::default(&fStack_104,__src,uVar7);
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(_Stack_100._M_pi._4_4_,_Stack_100._M_pi._0_4_);
      }
    }
    else {
      fStack_104 = *(float *)&__src->_vptr__Sp_counted_base;
      p_Var12 = __src;
    }
    uVar10._4_4_ = fStack_104;
    uVar10._0_4_ = local_108;
    _Stack_100._M_pi = p_Var12;
    BufferHandle::~BufferHandle(&local_f0);
  }
  sVar15.value.pointer.ptr = (char *)p_Var12;
  sVar15.value._0_8_ = uVar10;
  return (string_t)sVar15.value;
}

Assistant:

string_t UncompressedStringStorage::ReadOverflowString(ColumnSegment &segment, Vector &result, block_id_t block,
                                                       int32_t offset) {
	auto &block_manager = segment.GetBlockManager();
	auto &buffer_manager = block_manager.buffer_manager;
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();

	D_ASSERT(block != INVALID_BLOCK);
	D_ASSERT(offset < NumericCast<int32_t>(block_manager.GetBlockSize()));

	if (block < MAXIMUM_BLOCK) {
		// read the overflow string from disk
		// pin the initial handle and read the length
		auto block_handle = state.GetHandle(block_manager, block);
		auto handle = buffer_manager.Pin(block_handle);

		// read header
		uint32_t length = Load<uint32_t>(handle.Ptr() + offset);
		uint32_t remaining = length;
		offset += sizeof(uint32_t);

		BufferHandle target_handle;
		string_t overflow_string;
		data_ptr_t target_ptr;
		bool allocate_block = length >= block_manager.GetBlockSize();
		if (allocate_block) {
			// overflow string is bigger than a block - allocate a temporary buffer for it
			target_handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, length);
			target_ptr = target_handle.Ptr();
		} else {
			// overflow string is smaller than a block - add it to the vector directly
			overflow_string = StringVector::EmptyString(result, length);
			target_ptr = data_ptr_cast(overflow_string.GetDataWriteable());
		}

		// now append the string to the single buffer
		while (remaining > 0) {
			idx_t to_write = MinValue<idx_t>(remaining, block_manager.GetBlockSize() - sizeof(block_id_t) -
			                                                UnsafeNumericCast<idx_t>(offset));
			memcpy(target_ptr, handle.Ptr() + offset, to_write);
			remaining -= to_write;
			offset += UnsafeNumericCast<int32_t>(to_write);
			target_ptr += to_write;
			if (remaining > 0) {
				// read the next block
				block_id_t next_block = Load<block_id_t>(handle.Ptr() + offset);
				block_handle = state.GetHandle(block_manager, next_block);
				handle = buffer_manager.Pin(block_handle);
				offset = 0;
			}
		}
		if (allocate_block) {
			auto final_buffer = target_handle.Ptr();
			StringVector::AddHandle(result, std::move(target_handle));
			return ReadString(final_buffer, 0, length);
		} else {
			overflow_string.Finalize();
			return overflow_string;
		}
	}

	// read the overflow string from memory
	// first pin the handle, if it is not pinned yet
	auto entry = state.overflow_blocks.find(block);
	D_ASSERT(entry != state.overflow_blocks.end());
	auto handle = buffer_manager.Pin(entry->second.get().block);
	auto final_buffer = handle.Ptr();
	StringVector::AddHandle(result, std::move(handle));
	return ReadStringWithLength(final_buffer, offset);
}